

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.h
# Opt level: O2

void CVmRun::set_local_in_frame(vm_val_t *val,vm_val_t *fp,CVmDbgFrameSymPtr *symp)

{
  ushort *puVar1;
  
  puVar1 = (ushort *)symp->p_;
  set_local_in_frame(val,fp,(uint)*puVar1,(uint)((puVar1[1] & 3) == 1),puVar1[1] >> 1 & 1,
                     (uint)puVar1[2]);
  return;
}

Assistant:

uint get_var_num() const { return osrp2(p_); }